

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O2

lzham_decompress_state_ptr
lzham::lzham_lib_decompress_reinit(lzham_decompress_state_ptr p,lzham_decompress_params *pParams)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  void *pvVar4;
  lzham_decompress_state_ptr pvVar5;
  EVP_PKEY_CTX *ctx;
  uint uVar6;
  long lVar7;
  
  if (p == (lzham_decompress_state_ptr)0x0) {
    pvVar5 = lzham_lib_decompress_init(pParams);
    return pvVar5;
  }
  bVar3 = check_params(pParams);
  if (bVar3) {
    if ((*(byte *)((long)p + 0x144) & 1) == 0) {
      lVar7 = 1L << (*(byte *)((long)p + 0x13c) & 0x3f);
      ctx = *(EVP_PKEY_CTX **)((long)p + 0xe8);
      uVar6 = (uint)lVar7;
      if ((ctx == (EVP_PKEY_CTX *)0x0) || (*(uint *)((long)p + 0xe0) < uVar6)) {
        pvVar4 = lzham_realloc(*p,ctx,lVar7 + 0xf,(size_t *)0x0,true);
        if (pvVar4 == (void *)0x0) {
          return (lzham_decompress_state_ptr)0x0;
        }
        *(void **)((long)p + 0xe8) = pvVar4;
        *(uint *)((long)p + 0xe0) = uVar6;
        *(ulong *)((long)p + 0xf0) = (long)pvVar4 + 0xfU & 0xfffffffffffffff0;
      }
    }
    else {
      ctx = *(EVP_PKEY_CTX **)((long)p + 0xe8);
      lzham_free(*p,ctx);
      *(undefined4 *)((long)p + 0xe0) = 0;
      *(undefined8 *)((long)p + 0xe8) = 0;
      *(undefined8 *)((long)p + 0xf0) = 0;
    }
    *(undefined8 *)((long)p + 0x158) = *(undefined8 *)&pParams->m_table_max_update_interval;
    uVar1 = *(undefined8 *)pParams;
    uVar2 = *(undefined8 *)&pParams->m_table_update_rate;
    pvVar4 = pParams->m_pSeed_bytes;
    *(undefined8 *)((long)p + 0x148) = *(undefined8 *)&pParams->m_num_seed_bytes;
    *(void **)((long)p + 0x150) = pvVar4;
    *(undefined8 *)((long)p + 0x138) = uVar1;
    *(undefined8 *)((long)p + 0x140) = uVar2;
    lzham_decompressor::init((lzham_decompressor *)p,ctx);
    lzham_decompressor::reset_arith_tables((lzham_decompressor *)p);
  }
  else {
    p = (lzham_decompress_state_ptr)0x0;
  }
  return p;
}

Assistant:

lzham_decompress_state_ptr LZHAM_CDECL lzham_lib_decompress_reinit(lzham_decompress_state_ptr p, const lzham_decompress_params *pParams)
   {
      if (!p)
         return lzham_lib_decompress_init(pParams);
      
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if (!check_params(pParams))
         return NULL;
      
      if (pState->m_params.m_decompress_flags & LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED)
      {
         lzham_free(pState->m_malloc_context, pState->m_pRaw_decomp_buf);
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_raw_decomp_buf_size = 0;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         uint32 new_dict_size = 1U << pState->m_params.m_dict_size_log2;
         if ((!pState->m_pRaw_decomp_buf) || (pState->m_raw_decomp_buf_size < new_dict_size))
         {
            uint8 *pNew_dict = static_cast<uint8*>(lzham_realloc(pState->m_malloc_context, pState->m_pRaw_decomp_buf, new_dict_size + 15));
            if (!pNew_dict)
               return NULL;
            pState->m_pRaw_decomp_buf = pNew_dict;
            pState->m_raw_decomp_buf_size = new_dict_size;
            pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
         }
      }
      
      pState->m_params = *pParams;

      pState->init();

      pState->reset_arith_tables();
      return pState;
   }